

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetItem
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,Var value,PropertyOperationFlags flags)

{
  ScriptContext *scriptContext;
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *function;
  JavascriptArray *this_00;
  uint32 local_54;
  void *local_50;
  int i;
  IndexPropertyDescriptor *descriptor;
  JavascriptArray *local_38;
  
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if ((this->lengthWritable == false) &&
     ((arr->super_JavascriptArray).super_ArrayObject.length <= index)) {
LAB_00db6c72:
    JavascriptError::ThrowCantExtendIfStrictMode(flags,scriptContext);
LAB_00db6c7d:
    BVar3 = 0;
  }
  else {
    local_54 = index;
    descriptor = (IndexPropertyDescriptor *)value;
    local_38 = &arr->super_JavascriptArray;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_54,
                       (IndexPropertyDescriptor **)&i,(int *)&local_50);
    this_00 = local_38;
    if (bVar2) {
      if ((_i->Attributes & 8) == 0) {
        if ((_i->Attributes & 4) == 0) {
LAB_00db6bf4:
          JavascriptError::ThrowCantAssignIfStrictMode(flags,scriptContext);
          goto LAB_00db6c7d;
        }
        BVar3 = JavascriptArray::DirectGetItemAt<void*>(local_38,index,&local_50);
        if (BVar3 == 0) {
          aValue = (_i->Setter).ptr;
          if (aValue == (Var)0x0) {
            return 1;
          }
          function = VarTo<Js::RecyclableObject>(aValue);
          JavascriptOperators::CallSetter(function,instance,descriptor,(ScriptContext *)0x0);
          return 1;
        }
      }
      else {
        if (((this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags
            & 1) == 0) goto LAB_00db6c72;
        bVar2 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)local_38);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                      ,0x1a9,"(!arr->GetHasNoEnumerableProperties())",
                                      "!arr->GetHasNoEnumerableProperties()");
          if (!bVar2) goto LAB_00db6da2;
          *puVar4 = 0;
        }
        if (((_i->Getter).ptr != (void *)0x0) || ((_i->Setter).ptr != (void *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                      ,0x1ab,"(!descriptor->Getter && !descriptor->Setter)",
                                      "!descriptor->Getter && !descriptor->Setter");
          if (!bVar2) goto LAB_00db6da2;
          *puVar4 = 0;
        }
        _i->Attributes = '\a';
        this_00 = local_38;
      }
    }
    else {
      if (((this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
          1) == 0) {
        BVar3 = JavascriptArray::DirectGetItemAt<void*>(local_38,index,&local_50);
        if (BVar3 == 0) goto LAB_00db6c72;
        if ((this->dataItemAttributes & 4) == 0) goto LAB_00db6bf4;
      }
      bVar2 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)local_38);
      this_00 = local_38;
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x1d4,"(!arr->GetHasNoEnumerableProperties())",
                                    "!arr->GetHasNoEnumerableProperties()");
        if (!bVar2) {
LAB_00db6da2:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        this_00 = local_38;
      }
    }
    JavascriptArray::DirectSetItemAt<void*>(this_00,index,descriptor);
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItem(ES5Array* arr, DynamicObject* instance, uint32 index, Var value, PropertyOperationFlags flags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return CantExtend(flags, scriptContext);
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!(this->GetFlags() & this->IsExtensibleFlag))
                {
                    return CantExtend(flags, scriptContext);
                }

                // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
                Assert(!arr->GetHasNoEnumerableProperties());

                Assert(!descriptor->Getter && !descriptor->Setter);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
                arr->DirectSetItemAt(index, value);
                return true;
            }

            if (!(descriptor->Attributes & PropertyWritable))
            {
                return CantAssign(flags, scriptContext);
            }

            if (HasDataItem(arr, index))
            {
                arr->DirectSetItemAt(index, value);
            }
            else if (descriptor->Setter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Setter);
                // TODO : request context
                JavascriptOperators::CallSetter(func, instance, value, NULL);
            }

            return true;
        }

        //
        // Not found in attribute map. Extend or update data item.
        //
        if (!(this->GetFlags() & this->IsExtensibleFlag))
        {
            if (!HasDataItem(arr, index))
            {
                return CantExtend(flags, scriptContext);
            }
            else if (!(GetDataItemAttributes() & PropertyWritable))
            {
                return CantAssign(flags, scriptContext);
            }
        }

        // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
        Assert(!arr->GetHasNoEnumerableProperties());

        arr->DirectSetItemAt(index, value); // sharing data item attributes
        return true;
    }